

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

ON_EmbeddedFile *
ON_EmbeddedFile::FromModelComponentRef
          (ON_ModelComponentReference *ref,ON_EmbeddedFile *none_return_value)

{
  ON_ModelComponent *p;
  ON_EmbeddedFile *pOVar1;
  ON_EmbeddedFile *ef;
  ON_EmbeddedFile *none_return_value_local;
  ON_ModelComponentReference *ref_local;
  
  p = ON_ModelComponentReference::ModelComponent(ref);
  pOVar1 = Cast(&p->super_ON_Object);
  ref_local = (ON_ModelComponentReference *)none_return_value;
  if (pOVar1 != (ON_EmbeddedFile *)0x0) {
    ref_local = (ON_ModelComponentReference *)pOVar1;
  }
  return (ON_EmbeddedFile *)ref_local;
}

Assistant:

const ON_EmbeddedFile* ON_EmbeddedFile::FromModelComponentRef(const ON_ModelComponentReference& ref,
                                                              const ON_EmbeddedFile* none_return_value) // Static.
{
  const auto* ef = ON_EmbeddedFile::Cast(ref.ModelComponent());
  if (nullptr != ef)
    return ef;

  return none_return_value;
}